

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::get_value<unsigned_int>(Attribute *this,uint *v)

{
  value_type_conflict2 *pvVar1;
  optional<unsigned_int> local_30;
  optional<unsigned_int> local_28;
  optional<unsigned_int> ret;
  uint *v_local;
  Attribute *this_local;
  
  if (v == (uint *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret = (optional<unsigned_int>)v;
    primvar::PrimVar::get_value<unsigned_int>(&local_30,&this->_var);
    nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>(&local_28,&local_30);
    nonstd::optional_lite::optional<unsigned_int>::~optional(&local_30);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_28)
    ;
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<unsigned_int>::value(&local_28);
      *(value_type_conflict2 *)ret = *pvVar1;
    }
    nonstd::optional_lite::optional<unsigned_int>::~optional(&local_28);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }